

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::ImageInfiniteLight::ImageInfiniteLight
          (ImageInfiniteLight *this,Transform *renderFromLight,Image *im,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,Allocator alloc)

{
  Image *this_00;
  Tuple2<pbrt::Point2,_int> TVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  Bounds2f domain_00;
  Bounds2f domain_01;
  bool bVar17;
  Allocator alloc_00;
  int iVar18;
  long lVar19;
  long in_FS_OFFSET;
  float fVar20;
  double dVar21;
  MediumInterface MVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Array2D<float> d;
  Bounds2f domain;
  Tuple2<pbrt::Point2,_float> local_118;
  string *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  size_t vb;
  string local_c0 [32];
  string local_a0 [64];
  ImageChannelDesc channelDesc;
  
  MVar22._0_12_ = ZEXT812(0);
  MVar22.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits._4_4_ = 0;
  (this->super_LightBase).type = Infinite;
  (this->super_LightBase).mediumInterface = MVar22;
  uVar2 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar3 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar4 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar5 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar6 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar7 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar8 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar9 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar10 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar11 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar12 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar13 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar14 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar15 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar16 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] =
       *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar2;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar3;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar4;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar5;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar6;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar7;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar8;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = uVar9;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar10;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar11;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar12;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar13;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar14;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar15;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar16;
  *(long *)(in_FS_OFFSET + -0x550) = *(long *)(in_FS_OFFSET + -0x550) + 1;
  local_110 = &this->filename;
  std::__cxx11::string::string((string *)local_110,(string *)filename);
  this_00 = &this->image;
  Image::Image(this_00,im);
  this->imageColorSpace = imageColorSpace;
  this->scale = scale;
  WrapMode2D::WrapMode2D(&this->wrapMode,OctahedralSphere,OctahedralSphere);
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  PiecewiseConstant2D::PiecewiseConstant2D(&this->distribution,alloc);
  PiecewiseConstant2D::PiecewiseConstant2D(&this->compensatedDistribution,alloc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vb,"R",(allocator<char> *)&d);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"G",(allocator<char> *)&domain);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"B",(allocator<char> *)&local_118);
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&channelDesc,this_00,requestedChannels);
  lVar19 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&vb + lVar19));
    lVar19 = lVar19 + -0x20;
  } while (lVar19 != -0x20);
  if (channelDesc.offset.nStored == 0) {
    ErrorExit<std::__cxx11::string_const&>
              ("%s: image used for ImageInfiniteLight doesn\'t have R, G, B channels.",filename);
  }
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 3;
  vb = channelDesc.offset.nStored;
  if (channelDesc.offset.nStored != 3) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
               ,0x367,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x583612,
               (char (*) [19])"channelDesc.size()",(char (*) [2])0x583612,(int *)&d,
               (char (*) [19])"channelDesc.size()",(unsigned_long *)&vb);
  }
  bVar17 = ImageChannelDesc::IsIdentity(&channelDesc);
  if (bVar17) {
    TVar1 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    if (TVar1.x == TVar1.y) {
      auVar24._8_4_ = 0x3f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      auVar24._12_4_ = 0x3f800000;
      domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
      domain.pMin.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
      local_108._M_unused._M_object = (void *)0x0;
      local_108._8_8_ = 0;
      local_f0 = std::
                 _Function_handler<float_(pbrt::Point2<float>),_pbrt::Image::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h:398:46)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<float_(pbrt::Point2<float>),_pbrt::Image::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h:398:46)>
                 ::_M_manager;
      local_118 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar24);
      Bounds2<float>::Bounds2((Bounds2<float> *)&vb,&domain.pMin,(Point2<float> *)&local_118);
      alloc_00.memoryResource = pstd::pmr::new_delete_resource();
      Image::GetSamplingDistribution
                (&d,this_00,(function<float_(pbrt::Point2<float>)> *)&local_108,(Bounds2f *)&vb,
                 alloc_00);
      std::_Function_base::~_Function_base((_Function_base *)&local_108);
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      vb = 0;
      local_118 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar23);
      Bounds2<float>::Bounds2(&domain,(Point2<float> *)&vb,(Point2<float> *)&local_118);
      domain_00.pMax.super_Tuple2<pbrt::Point2,_float> =
           domain.pMax.super_Tuple2<pbrt::Point2,_float>;
      domain_00.pMin.super_Tuple2<pbrt::Point2,_float> =
           domain.pMin.super_Tuple2<pbrt::Point2,_float>;
      PiecewiseConstant2D::PiecewiseConstant2D((PiecewiseConstant2D *)&vb,&d,domain_00,alloc);
      PiecewiseConstant2D::operator=(&this->distribution,(PiecewiseConstant2D *)&vb);
      PiecewiseConstant2D::~PiecewiseConstant2D((PiecewiseConstant2D *)&vb);
      dVar21 = std::accumulate<float*,double>
                         (d.values,d.values +
                                   (d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                                   d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) *
                                   (d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                                   d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x),0.0);
      iVar18 = (d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
               d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) *
               (d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
               d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
      fVar20 = (float)(dVar21 / (double)iVar18);
      for (lVar19 = 0; (long)iVar18 * 4 != lVar19; lVar19 = lVar19 + 4) {
        auVar23 = vminss_avx(ZEXT416((uint)*(float *)((long)d.values + lVar19)),
                             ZEXT416((uint)(fVar20 * 0.001)));
        auVar23 = vmaxss_avx(auVar23,ZEXT416((uint)(*(float *)((long)d.values + lVar19) - fVar20)));
        *(int *)((long)d.values + lVar19) = auVar23._0_4_;
      }
      domain_01.pMax.super_Tuple2<pbrt::Point2,_float> =
           domain.pMax.super_Tuple2<pbrt::Point2,_float>;
      domain_01.pMin.super_Tuple2<pbrt::Point2,_float> =
           domain.pMin.super_Tuple2<pbrt::Point2,_float>;
      PiecewiseConstant2D::PiecewiseConstant2D((PiecewiseConstant2D *)&vb,&d,domain_01,alloc);
      PiecewiseConstant2D::operator=(&this->compensatedDistribution,(PiecewiseConstant2D *)&vb);
      PiecewiseConstant2D::~PiecewiseConstant2D((PiecewiseConstant2D *)&vb);
      Array2D<float>::~Array2D(&d);
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&channelDesc.offset);
      return;
    }
    d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = TVar1;
    vb = (size_t)TVar1;
    ErrorExit<std::__cxx11::string_const&,int,int>
              ("%s: image resolution (%d, %d) is non-square. It\'s unlikely this is an equirect environment map."
               ,filename,(int *)&vb,&d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
  }
  LogFatal<char_const(&)[25]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
             ,0x368,"Check failed: %s",(char (*) [25])"channelDesc.IsIdentity()");
}

Assistant:

ImageInfiniteLight::ImageInfiniteLight(const Transform &renderFromLight, Image im,
                                       const RGBColorSpace *imageColorSpace, Float scale,
                                       const std::string &filename, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(std::move(im)),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      wrapMode(WrapMode::OctahedralSphere, WrapMode::OctahedralSphere),
      distribution(alloc),
      compensatedDistribution(alloc) {
    // Initialize sampling PDFs for image infinite area light
    ImageChannelDesc channelDesc = image.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for ImageInfiniteLight doesn't have R, G, B "
                  "channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());
    if (image.Resolution().x != image.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an equirect environment map.",
                  filename, image.Resolution().x, image.Resolution().y);
    Array2D<Float> d = image.GetSamplingDistribution();
    Bounds2f domain = Bounds2f(Point2f(0, 0), Point2f(1, 1));
    distribution = PiecewiseConstant2D(d, domain, alloc);

    // Initialize compensated PDF for image infinite area light
    Float average = std::accumulate(d.begin(), d.end(), 0.) / d.size();
    for (Float &v : d)
        v = std::max<Float>(v - average, std::min<Float>(.001f * average, v));
    compensatedDistribution = PiecewiseConstant2D(d, domain, alloc);
}